

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O1

void __thiscall
jsonrpccxx::JsonRpcException::JsonRpcException
          (JsonRpcException *this,int code,string *message,json *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  pointer pcVar3;
  uint uVar4;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  uint __val;
  undefined8 uVar11;
  uint __len;
  string __str;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  string_t local_b0;
  long *local_90 [2];
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  *(undefined ***)this = &PTR__JsonRpcException_001a17e8;
  this->code = code;
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  pcVar3 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message,pcVar3,pcVar3 + message->_M_string_length);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->data,data);
  __val = -code;
  if (0 < code) {
    __val = code;
  }
  __len = 1;
  if (9 < __val) {
    uVar10 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_00133a96;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_00133a96;
      }
      if (uVar7 < 10000) goto LAB_00133a96;
      uVar10 = uVar10 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_00133a96:
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct((ulong)local_90,(char)__len - (char)(code >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)code >> 0x1f) + (long)local_90[0]),__len,__val);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_60 = *plVar8;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar8;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(message->_M_dataplus)._M_p);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_40 = *plVar8;
    lStack_38 = plVar5[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar8;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_c0 = *puVar9;
    lStack_b8 = plVar5[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar9;
    local_d0 = (ulong *)*plVar5;
  }
  local_c8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump(&local_b0,data,-1,' ',false,strict);
  uVar10 = 0xf;
  if (local_d0 != &local_c0) {
    uVar10 = local_c0;
  }
  if (uVar10 < local_b0._M_string_length + local_c8) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar11 = local_b0.field_2._M_allocated_capacity;
    }
    if (local_b0._M_string_length + local_c8 <= (ulong)uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
      goto LAB_00133c5a;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0._M_dataplus._M_p);
LAB_00133c5a:
  paVar1 = &(this->err).field_2;
  (this->err)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar2) {
    uVar11 = puVar6[3];
    paVar1->_M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&(this->err).field_2 + 8) = uVar11;
  }
  else {
    (this->err)._M_dataplus._M_p = (pointer)*puVar6;
    (this->err).field_2._M_allocated_capacity = *psVar2;
  }
  (this->err)._M_string_length = puVar6[1];
  *puVar6 = psVar2;
  puVar6[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  return;
}

Assistant:

JsonRpcException(int code, const std::string &message, const json &data) noexcept
        : code(code), message(message), data(data), err(std::to_string(code) + ": " + message + ", data: " + data.dump()) {}